

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDependencies
          (SDGDependenciesBuilder *this,DGBBlock *block,BasicBlock *B)

{
  bool bVar1;
  iterator this_00;
  reference ppVVar2;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *in_RDI;
  Value *unaff_retaddr;
  Value *dep;
  iterator __end2;
  iterator __begin2;
  ValVec *__range2;
  Value *in_stack_ffffffffffffffb0;
  LLVMControlDependenceAnalysis *in_stack_ffffffffffffffb8;
  undefined1 local_38 [24];
  undefined1 *local_20;
  
  LLVMControlDependenceAnalysis::getDependencies
            (in_stack_ffffffffffffffb8,(BasicBlock *)in_stack_ffffffffffffffb0);
  local_20 = local_38;
  this_00 = std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin(in_RDI);
  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
              ::operator*((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                           *)&stack0xffffffffffffffc0);
    in_stack_ffffffffffffffb0 = *ppVVar2;
    addControlDep((SDGDependenciesBuilder *)__end2._M_current,(DepDGElement *)dep,unaff_retaddr);
    __gnu_cxx::
    __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>::
    operator++((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                *)&stack0xffffffffffffffc0);
  }
  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
            ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)this_00._M_current);
  return;
}

Assistant:

void addControlDependencies(sdg::DGBBlock *block, llvm::BasicBlock &B) {
        assert(block);
        for (auto *dep : CDA->getDependencies(&B)) {
            addControlDep(block, dep);
        }
    }